

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O2

void __thiscall
Lib::
BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
::~BinaryHeap(BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Rhs>_>
              *this)

{
  if (this->_data != (UnresolvedSplitRecord *)0x0) {
    Lib::free(this->_data);
  }
  return;
}

Assistant:

~BinaryHeap()
  {
    if(_data) {
      T* ep=_data+_size;
      while(ep!=_data1) {
	(--ep)->~T();
      }
      DEALLOC_KNOWN(_data,_capacity*sizeof(T),"BinaryHeap::T");
    }
  }